

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O3

int get_node_level(adh_node_t *node)

{
  int iVar1;
  
  iVar1 = -1;
  do {
    node = node->parent;
    iVar1 = iVar1 + 1;
  } while (node != (adh_node *)0x0);
  return iVar1;
}

Assistant:

int get_node_level(const adh_node_t *node) {
#ifdef _DEBUG
    log_trace("  get_node_level", "%s \n", fmt_node(node));
#endif

    int level = 0;
    adh_node_t * parent = node->parent;
    while(parent != NULL) {
        level++;
        parent = parent->parent;
    }
    return level;
}